

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int g_write(lua_State *L,FILE *f,int arg)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  bool local_49;
  bool local_39;
  char *s;
  size_t l;
  int local_20;
  int status;
  int nargs;
  int arg_local;
  FILE *f_local;
  lua_State *L_local;
  
  status = arg;
  _nargs = (FILE *)f;
  f_local = (FILE *)L;
  local_20 = lua_gettop(L);
  local_20 = local_20 + -1;
  l._4_4_ = 1;
  while (local_20 != 0) {
    local_20 = local_20 + -1;
    iVar1 = lua_type((lua_State *)f_local,status);
    __stream = _nargs;
    if (iVar1 == 3) {
      local_39 = false;
      local_49 = local_39;
      if (l._4_4_ != 0) {
        lua_tonumber((lua_State *)f_local,status);
        iVar1 = fprintf(__stream,"%.14g");
        local_49 = 0 < iVar1;
      }
    }
    else {
      pcVar2 = luaL_checklstring((lua_State *)f_local,status,(size_t *)&s);
      local_49 = false;
      if (l._4_4_ != 0) {
        pcVar2 = (char *)fwrite(pcVar2,1,(size_t)s,_nargs);
        local_49 = pcVar2 == s;
      }
    }
    l._4_4_ = (uint)local_49;
    status = status + 1;
  }
  local_20 = local_20 + -1;
  iVar1 = pushresult((lua_State *)f_local,l._4_4_,(char *)0x0);
  return iVar1;
}

Assistant:

static int g_write(lua_State*L,FILE*f,int arg){
int nargs=lua_gettop(L)-1;
int status=1;
for(;nargs--;arg++){
if(lua_type(L,arg)==3){
status=status&&
fprintf(f,"%.14g",lua_tonumber(L,arg))>0;
}
else{
size_t l;
const char*s=luaL_checklstring(L,arg,&l);
status=status&&(fwrite(s,sizeof(char),l,f)==l);
}
}
return pushresult(L,status,NULL);
}